

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docking-data.cpp
# Opt level: O1

ostream * operator<<(ostream *os,vm<value_mask_strategy> *machine)

{
  pointer pcVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  _Variadic_union<std::monostate,_update_bitmask,_write_memory> local_48;
  undefined1 local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"VM (mask: ",10);
  local_48._0_8_ = (long)&local_48 + 0x10;
  pcVar1 = (machine->mask).mask._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (machine->mask).mask._M_string_length);
  local_28 = 1;
  operator<<(os,(instruction_t *)&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(os,", memory: ",10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," elements sum to ",0x11);
  for (p_Var3 = (machine->mem)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(machine->mem)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__detail::__variant::_Variant_storage<false,_std::monostate,_update_bitmask,_write_memory>::
  ~_Variant_storage((_Variant_storage<false,_std::monostate,_update_bitmask,_write_memory> *)
                    &local_48);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const vm<S>& machine) {
  os << "VM (mask: " << machine.mask << ", memory: " << machine.mem.size() << " elements sum to " << machine.sum() << ")";
  return os;
}